

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::VerifySignatureRequest,cfd::js::api::json::VerifySignatureResponse,cfd::js::api::VerifySignatureRequestStruct,cfd::js::api::VerifySignatureResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  string *json_message;
  VerifySignatureResponse res;
  VerifySignatureRequestStruct request;
  VerifySignatureRequest req;
  undefined1 local_550 [16];
  _Alloc_hider local_540;
  size_type local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  _Alloc_hider local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_500;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0;
  string local_4a0;
  undefined1 local_480 [16];
  _Alloc_hider local_470;
  char local_460 [16];
  _Alloc_hider local_450;
  undefined1 local_448 [64];
  _Alloc_hider local_408;
  undefined1 auStack_400 [8];
  _Rb_tree_node_base local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  VerifySignatureRequestStruct local_3c8;
  VerifySignatureRequest local_208;
  
  VerifySignatureRequest::VerifySignatureRequest(&local_208);
  core::JsonClassBase<cfd::js::api::json::VerifySignatureRequest>::Deserialize
            (&local_208.super_JsonClassBase<cfd::js::api::json::VerifySignatureRequest>,
             (string *)this);
  VerifySignatureRequest::ConvertToStruct(&local_3c8,&local_208);
  local_550[0] = true;
  local_550._8_4_ = 0;
  local_540._M_p = (pointer)&local_530;
  local_538 = 0;
  local_530._M_local_buf[0] = '\0';
  local_520._M_p = (pointer)&local_510;
  local_518 = 0;
  local_510._M_local_buf[0] = '\0';
  p_Var1 = &local_500._M_impl.super__Rb_tree_header;
  local_500._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_500._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_500._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_4d0._M_impl.super__Rb_tree_header;
  local_4d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_500._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_500._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_4d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_4d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_3c8.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005f59e1:
      uVar4 = std::__throw_bad_function_call();
      local_480._0_8_ = &PTR__VerifySignatureResponse_00a7deb0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_480 + 8));
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((_Rb_tree_header *)pcVar3 != p_Var2) {
        operator_delete(pcVar3);
      }
      VerifySignatureResponseStruct::~VerifySignatureResponseStruct
                ((VerifySignatureResponseStruct *)local_550);
      VerifySignatureRequestStruct::~VerifySignatureRequestStruct(&local_3c8);
      VerifySignatureRequest::~VerifySignatureRequest(&local_208);
      _Unwind_Resume(uVar4);
    }
    (*bitcoin_function->_M_invoker)
              ((VerifySignatureResponseStruct *)local_480,(_Any_data *)bitcoin_function,&local_3c8);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f59e1;
    (**(code **)((long)&request_message->field_2 + 8))(local_480,request_message,&local_3c8);
  }
  local_550[0] = local_480[0];
  local_550._8_4_ = local_480._8_4_;
  std::__cxx11::string::operator=((string *)&local_540,(string *)&local_470);
  std::__cxx11::string::operator=((string *)&local_520,(string *)&local_450);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_500);
  if ((_Base_ptr)local_448._40_8_ != (_Base_ptr)0x0) {
    local_500._M_impl.super__Rb_tree_header._M_header._M_color = local_448._32_4_;
    local_500._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_448._40_8_;
    local_500._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_448._48_8_;
    local_500._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_448._56_8_;
    *(_Rb_tree_header **)(local_448._40_8_ + 8) = p_Var1;
    local_500._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_408._M_p;
    local_448._40_8_ = (_Base_ptr)0x0;
    local_408._M_p = (pointer)0x0;
    local_448._48_8_ = (_Base_ptr)(local_448 + 0x20);
    local_448._56_8_ = (_Base_ptr)(local_448 + 0x20);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_4d0);
  if (local_3f8._M_parent != (_Base_ptr)0x0) {
    local_4d0._M_impl.super__Rb_tree_header._M_header._M_color = local_3f8._M_color;
    local_4d0._M_impl.super__Rb_tree_header._M_header._M_parent = local_3f8._M_parent;
    local_4d0._M_impl.super__Rb_tree_header._M_header._M_left = local_3f8._M_left;
    local_4d0._M_impl.super__Rb_tree_header._M_header._M_right = local_3f8._M_right;
    *(_Rb_tree_header **)((long)local_3f8._M_parent + 8) = p_Var2;
    local_4d0._M_impl.super__Rb_tree_header._M_node_count = local_3d8._M_allocated_capacity;
    local_3f8._M_parent = (_Base_ptr)0x0;
    local_3d8._M_allocated_capacity = 0;
    local_3f8._M_left = &local_3f8;
    local_3f8._M_right = &local_3f8;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_400);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_448 + 0x18));
  if (local_450._M_p != local_448 + 8) {
    operator_delete(local_450._M_p);
  }
  if (local_470._M_p != local_460) {
    operator_delete(local_470._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_550._8_4_ == 0) {
    VerifySignatureResponse::VerifySignatureResponse((VerifySignatureResponse *)local_480);
    VerifySignatureResponse::ConvertFromStruct
              ((VerifySignatureResponse *)local_480,(VerifySignatureResponseStruct *)local_550);
    core::JsonClassBase<cfd::js::api::json::VerifySignatureResponse>::Serialize_abi_cxx11_
              (&local_4a0,(JsonClassBase<cfd::js::api::json::VerifySignatureResponse> *)local_480);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    local_480._0_8_ = &PTR__VerifySignatureResponse_00a7deb0;
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_480,(InnerErrorResponseStruct *)(local_550 + 8));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_4a0,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_480);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    local_480._0_8_ = &PTR__ErrorResponseBase_00a78a38;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_448);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_480 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_p != &local_510) {
    operator_delete(local_520._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_p != &local_530) {
    operator_delete(local_540._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_3c8.ignore_items._M_t);
  std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>::
  ~vector(&local_3c8.utxos);
  VerifySignatureTxInRequestStruct::~VerifySignatureTxInRequestStruct(&local_3c8.txin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.tx._M_dataplus._M_p != &local_3c8.tx.field_2) {
    operator_delete(local_3c8.tx._M_dataplus._M_p);
  }
  VerifySignatureRequest::~VerifySignatureRequest(&local_208);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}